

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateServiceOptions
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *pFVar3;
  MethodDescriptor *pMVar4;
  MethodDescriptorProto *pMVar5;
  ServiceDescriptor *in_RSI;
  DescriptorBuilder *in_RDI;
  int i;
  ErrorLocation in_stack_0000003c;
  Message *in_stack_00000040;
  string *in_stack_00000048;
  DescriptorBuilder *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar6;
  int local_1c;
  
  ServiceDescriptor::file(in_RSI);
  bVar1 = IsLite((FileDescriptor *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (bVar1) {
    pFVar3 = ServiceDescriptor::file(in_RSI);
    FileDescriptor::options(pFVar3);
    bVar1 = FileOptions::cc_generic_services((FileOptions *)0x4c854f);
    if (!bVar1) {
      pFVar3 = ServiceDescriptor::file(in_RSI);
      FileDescriptor::options(pFVar3);
      bVar1 = FileOptions::java_generic_services((FileOptions *)0x4c856d);
      if (!bVar1) goto LAB_004c8598;
    }
    ServiceDescriptor::full_name_abi_cxx11_(in_RSI);
    AddError(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c,(char *)this);
  }
LAB_004c8598:
  local_1c = 0;
  while (iVar6 = local_1c, iVar2 = ServiceDescriptor::method_count(in_RSI), iVar6 < iVar2) {
    pMVar4 = (MethodDescriptor *)(*(long *)(in_RSI + 0x20) + (long)local_1c * 0x68);
    pMVar5 = ServiceDescriptorProto::method
                       ((ServiceDescriptorProto *)CONCAT44(iVar6,in_stack_ffffffffffffffd0),
                        (int)((ulong)pMVar4 >> 0x20));
    ValidateMethodOptions(in_RDI,pMVar4,pMVar5);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateServiceOptions(
    ServiceDescriptor* service, const ServiceDescriptorProto& proto) {
  if (IsLite(service->file()) &&
      (service->file()->options().cc_generic_services() ||
       service->file()->options().java_generic_services())) {
    AddError(service->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services "
             "unless you set both options cc_generic_services and "
             "java_generic_services to false.");
  }

  VALIDATE_OPTIONS_FROM_ARRAY(service, method, Method);
}